

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall gl4cts::ShaderSubroutine::FunctionalTest16::initTest(FunctionalTest16 *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  GLenum GVar4;
  GLint GVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar7;
  TestError *pTVar8;
  ulong uVar9;
  _subroutine_uniform_value_verification local_3d8;
  _test_case local_3d4;
  _subroutine_uniform_value_verification local_3d0;
  _test_case local_3cc;
  GLuint *local_3c8;
  _item *current_item;
  uint n_item;
  uint n_items;
  _item items [10];
  GLchar *local_2c0;
  char *vs_body_raw_ptr;
  char *te_body_raw_ptr;
  char *tc_body_raw_ptr;
  GLint link_status [5];
  GLchar *local_288;
  char *gs_body_raw_ptr;
  char *fs_body_raw_ptr;
  uint local_f8;
  _shader_stage local_f4;
  undefined1 local_f0 [8];
  string vs_body;
  undefined1 local_c8 [8];
  string te_body;
  undefined1 local_a0 [8];
  string tc_body;
  _shader_stage local_6c;
  undefined1 local_68 [8];
  string gs_body;
  undefined1 local_40 [8];
  string fs_body;
  uint n_id;
  Functions *gl;
  FunctionalTest16 *this_local;
  Functions *gl_00;
  
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar6->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar2);
  fs_body.field_2._12_4_ = 0;
  do {
    if (1 < (uint)fs_body.field_2._12_4_) {
      return;
    }
    gs_body.field_2._12_4_ = 4;
    getShaderBody_abi_cxx11_
              ((string *)local_40,this,(_shader_stage *)(gs_body.field_2._M_local_buf + 0xc),
               (uint *)(fs_body.field_2._M_local_buf + 0xc));
    local_6c = SHADER_STAGE_GEOMETRY;
    getShaderBody_abi_cxx11_
              ((string *)local_68,this,&local_6c,(uint *)(fs_body.field_2._M_local_buf + 0xc));
    te_body.field_2._12_4_ = 1;
    getShaderBody_abi_cxx11_
              ((string *)local_a0,this,(_shader_stage *)(te_body.field_2._M_local_buf + 0xc),
               (uint *)(fs_body.field_2._M_local_buf + 0xc));
    vs_body.field_2._12_4_ = 2;
    getShaderBody_abi_cxx11_
              ((string *)local_c8,this,(_shader_stage *)(vs_body.field_2._M_local_buf + 0xc),
               (uint *)(fs_body.field_2._M_local_buf + 0xc));
    local_f4 = SHADER_STAGE_FIRST;
    getShaderBody_abi_cxx11_
              ((string *)local_f0,this,&local_f4,(uint *)(fs_body.field_2._M_local_buf + 0xc));
    local_f8 = 0;
    uVar9 = (ulong)(uint)fs_body.field_2._12_4_;
    bVar1 = Utils::buildProgram(gl_00,(string *)local_f0,(string *)local_a0,(string *)local_c8,
                                (string *)local_68,(string *)local_40,(GLchar **)0x0,&local_f8,
                                this->m_vs_ids + uVar9,this->m_tc_ids + uVar9,this->m_te_ids + uVar9
                                ,this->m_gs_ids + uVar9,this->m_fs_ids + uVar9,
                                this->m_po_ids + uVar9);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      this_00 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&fs_body_raw_ptr,this_00,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&fs_body_raw_ptr,
                          (char (*) [45])"Failed to build test program object, index:[");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(uint *)(fs_body.field_2._M_local_buf + 0xc));
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x29dc08e);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&fs_body_raw_ptr);
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar8,"Failed to build a test program",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                 ,0x2025);
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if ((this->m_are_pipeline_objects_supported & 1U) != 0) {
      gs_body_raw_ptr = (char *)std::__cxx11::string::c_str();
      local_288 = (GLchar *)std::__cxx11::string::c_str();
      tc_body_raw_ptr = (char *)0x0;
      link_status[0] = 0;
      link_status[1] = 0;
      link_status[2] = 0;
      te_body_raw_ptr = (char *)std::__cxx11::string::c_str();
      vs_body_raw_ptr = (char *)std::__cxx11::string::c_str();
      local_2c0 = (GLchar *)std::__cxx11::string::c_str();
      GVar3 = (*gl_00->createShaderProgramv)(0x8b30,1,&gs_body_raw_ptr);
      this->m_fs_po_ids[(uint)fs_body.field_2._12_4_] = GVar3;
      GVar3 = (*gl_00->createShaderProgramv)(0x8dd9,1,&local_288);
      this->m_gs_po_ids[(uint)fs_body.field_2._12_4_] = GVar3;
      GVar3 = (*gl_00->createShaderProgramv)(0x8e88,1,&te_body_raw_ptr);
      this->m_tc_po_ids[(uint)fs_body.field_2._12_4_] = GVar3;
      GVar3 = (*gl_00->createShaderProgramv)(0x8e87,1,&vs_body_raw_ptr);
      this->m_te_po_ids[(uint)fs_body.field_2._12_4_] = GVar3;
      GVar3 = (*gl_00->createShaderProgramv)(0x8b31,1,&local_2c0);
      this->m_vs_po_ids[(uint)fs_body.field_2._12_4_] = GVar3;
      GVar4 = (*gl_00->getError)();
      glu::checkError(GVar4,"glCreateShaderProgramv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x2037);
      (*gl_00->getProgramiv)
                (this->m_fs_po_ids[(uint)fs_body.field_2._12_4_],0x8b82,(GLint *)&tc_body_raw_ptr);
      (*gl_00->getProgramiv)
                (this->m_gs_po_ids[(uint)fs_body.field_2._12_4_],0x8b82,
                 (GLint *)((long)&tc_body_raw_ptr + 4));
      (*gl_00->getProgramiv)(this->m_tc_po_ids[(uint)fs_body.field_2._12_4_],0x8b82,link_status);
      (*gl_00->getProgramiv)(this->m_te_po_ids[(uint)fs_body.field_2._12_4_],0x8b82,link_status + 1)
      ;
      (*gl_00->getProgramiv)(this->m_vs_po_ids[(uint)fs_body.field_2._12_4_],0x8b82,link_status + 2)
      ;
      GVar4 = (*gl_00->getError)();
      glu::checkError(GVar4,"glGetProgramiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x203e);
      if ((int)tc_body_raw_ptr == 0) {
        pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar8,"Fragment shader program failed to link",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                   ,0x2041);
        __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      if (tc_body_raw_ptr._4_4_ == 0) {
        pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar8,"Geometry shader program failed to link",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                   ,0x2043);
        __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      if (link_status[0] == 0) {
        pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar8,"Tessellation control shader program failed to link",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                   ,0x2045);
        __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      if (link_status[1] == 0) {
        pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar8,"Tessellation evaluation shader program failed to link",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                   ,0x2047);
        __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      if (link_status[2] == 0) {
        pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar8,"Vertex shader program failed to link",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                   ,0x2049);
        __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      (*gl_00->genProgramPipelines)(1,this->m_pipeline_object_ids + (uint)fs_body.field_2._12_4_);
      GVar4 = (*gl_00->getError)();
      glu::checkError(GVar4,"glGenProgramPipelines() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x204d);
      (*gl_00->useProgramStages)
                (this->m_pipeline_object_ids[(uint)fs_body.field_2._12_4_],2,
                 this->m_fs_po_ids[(uint)fs_body.field_2._12_4_]);
      (*gl_00->useProgramStages)
                (this->m_pipeline_object_ids[(uint)fs_body.field_2._12_4_],4,
                 this->m_gs_po_ids[(uint)fs_body.field_2._12_4_]);
      (*gl_00->useProgramStages)
                (this->m_pipeline_object_ids[(uint)fs_body.field_2._12_4_],8,
                 this->m_tc_po_ids[(uint)fs_body.field_2._12_4_]);
      (*gl_00->useProgramStages)
                (this->m_pipeline_object_ids[(uint)fs_body.field_2._12_4_],0x10,
                 this->m_te_po_ids[(uint)fs_body.field_2._12_4_]);
      (*gl_00->useProgramStages)
                (this->m_pipeline_object_ids[(uint)fs_body.field_2._12_4_],1,
                 this->m_vs_po_ids[(uint)fs_body.field_2._12_4_]);
      GVar4 = (*gl_00->getError)();
      glu::checkError(GVar4,"glUseProgramStages() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x2054);
    }
    n_item = this->m_po_ids[(uint)fs_body.field_2._12_4_];
    items[0]._0_8_ = this->m_po_descriptors + (uint)fs_body.field_2._12_4_;
    items[0].stage._0_4_ = this->m_fs_ids[(uint)fs_body.field_2._12_4_];
    items[0].stage._4_4_ = 0x8b30;
    items[0].so_id = this->m_po_ids[(uint)fs_body.field_2._12_4_];
    items[1]._0_8_ = &this->m_po_descriptors[(uint)fs_body.field_2._12_4_].geometry;
    items[1].stage._0_4_ = this->m_gs_ids[(uint)fs_body.field_2._12_4_];
    items[1].stage._4_4_ = 0x8dd9;
    items[1].so_id = this->m_po_ids[(uint)fs_body.field_2._12_4_];
    items[2]._0_8_ = &this->m_po_descriptors[(uint)fs_body.field_2._12_4_].tess_control;
    items[2].stage._0_4_ = this->m_tc_ids[(uint)fs_body.field_2._12_4_];
    items[2].stage._4_4_ = 0x8e88;
    items[2].so_id = this->m_po_ids[(uint)fs_body.field_2._12_4_];
    items[3]._0_8_ = &this->m_po_descriptors[(uint)fs_body.field_2._12_4_].tess_evaluation;
    items[3].stage._0_4_ = this->m_te_ids[(uint)fs_body.field_2._12_4_];
    items[3].stage._4_4_ = 0x8e87;
    items[3].so_id = this->m_po_ids[(uint)fs_body.field_2._12_4_];
    items[4]._0_8_ = &this->m_po_descriptors[(uint)fs_body.field_2._12_4_].vertex;
    items[4].stage._0_4_ = this->m_vs_ids[(uint)fs_body.field_2._12_4_];
    items[4].stage._4_4_ = 0x8b31;
    items[4].so_id = this->m_fs_po_ids[(uint)fs_body.field_2._12_4_];
    items[5]._0_8_ = this->m_fs_po_descriptors + (uint)fs_body.field_2._12_4_;
    items[5].stage._0_4_ = this->m_fs_po_ids[(uint)fs_body.field_2._12_4_];
    items[5].stage._4_4_ = 0x8b30;
    items[5].so_id = this->m_gs_po_ids[(uint)fs_body.field_2._12_4_];
    items[6]._0_8_ = this->m_gs_po_descriptors + (uint)fs_body.field_2._12_4_;
    items[6].stage._0_4_ = this->m_gs_po_ids[(uint)fs_body.field_2._12_4_];
    items[6].stage._4_4_ = 0x8dd9;
    items[6].so_id = this->m_tc_po_ids[(uint)fs_body.field_2._12_4_];
    items[7]._0_8_ = this->m_tc_po_descriptors + (uint)fs_body.field_2._12_4_;
    items[7].stage._0_4_ = this->m_tc_po_ids[(uint)fs_body.field_2._12_4_];
    items[7].stage._4_4_ = 0x8e88;
    items[7].so_id = this->m_te_po_ids[(uint)fs_body.field_2._12_4_];
    items[8]._0_8_ = this->m_te_po_descriptors + (uint)fs_body.field_2._12_4_;
    items[8].stage._0_4_ = this->m_te_po_ids[(uint)fs_body.field_2._12_4_];
    items[8].stage._4_4_ = 0x8e87;
    items[8].so_id = this->m_vs_po_ids[(uint)fs_body.field_2._12_4_];
    items[9]._0_8_ = this->m_vs_po_descriptors + (uint)fs_body.field_2._12_4_;
    items[9].stage._0_4_ = this->m_vs_po_ids[(uint)fs_body.field_2._12_4_];
    items[9].stage._4_4_ = 0x8b31;
    current_item._4_4_ = 10;
    for (current_item._0_4_ = 0; (uint)current_item < 10;
        current_item._0_4_ = (uint)current_item + 1) {
      local_3c8 = &n_item + (ulong)(uint)current_item * 6;
      GVar3 = (*gl_00->getSubroutineIndex)
                        (*local_3c8,*(GLenum *)((long)&items[(uint)current_item].stage + 4),
                         "function1");
      *(GLuint *)(*(long *)(local_3c8 + 2) + 0x20) = GVar3;
      GVar3 = (*gl_00->getSubroutineIndex)(*local_3c8,local_3c8[5],"function2");
      *(GLuint *)(*(long *)(local_3c8 + 2) + 0x24) = GVar3;
      GVar3 = (*gl_00->getSubroutineIndex)(*local_3c8,local_3c8[5],"function3");
      *(GLuint *)(*(long *)(local_3c8 + 2) + 0x28) = GVar3;
      GVar3 = (*gl_00->getSubroutineIndex)(*local_3c8,local_3c8[5],"function4");
      *(GLuint *)(*(long *)(local_3c8 + 2) + 0x2c) = GVar3;
      GVar4 = (*gl_00->getError)();
      glu::checkError(GVar4,"glGetSubroutineIndex() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x2079);
      if ((((*(int *)(*(long *)(local_3c8 + 2) + 0x20) == -1) ||
           (*(int *)(*(long *)(local_3c8 + 2) + 0x24) == -1)) ||
          (*(int *)(*(long *)(local_3c8 + 2) + 0x28) == -1)) ||
         (*(int *)(*(long *)(local_3c8 + 2) + 0x2c) == -1)) {
        pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar8,"Subroutine name was not recognized.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                   ,0x2080);
        __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      GVar5 = (*gl_00->getSubroutineUniformLocation)(*local_3c8,local_3c8[5],"subroutine1");
      *(GLint *)(*(long *)(local_3c8 + 2) + 0x10) = GVar5;
      GVar5 = (*gl_00->getSubroutineUniformLocation)(*local_3c8,local_3c8[5],"subroutine2");
      *(GLint *)(*(long *)(local_3c8 + 2) + 0x14) = GVar5;
      GVar5 = (*gl_00->getSubroutineUniformLocation)(*local_3c8,local_3c8[5],"subroutine3");
      *(GLint *)(*(long *)(local_3c8 + 2) + 0x18) = GVar5;
      GVar5 = (*gl_00->getSubroutineUniformLocation)(*local_3c8,local_3c8[5],"subroutine4");
      *(GLint *)(*(long *)(local_3c8 + 2) + 0x1c) = GVar5;
      GVar4 = (*gl_00->getError)();
      glu::checkError(GVar4,"glGetSubroutineUniformLocation() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x208b);
      if (((*(int *)(*(long *)(local_3c8 + 2) + 0x10) == -1) ||
          (*(int *)(*(long *)(local_3c8 + 2) + 0x14) == -1)) ||
         ((*(int *)(*(long *)(local_3c8 + 2) + 0x18) == -1 ||
          (*(int *)(*(long *)(local_3c8 + 2) + 0x1c) == -1)))) {
        pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar8,"Subroutine uniform name was not recognized.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                   ,0x2092);
        __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      if (this->m_po_ids[(uint)fs_body.field_2._12_4_] == *local_3c8) {
        (*gl_00->useProgram)(*local_3c8);
        GVar4 = (*gl_00->getError)();
        glu::checkError(GVar4,"glUseProgram() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x2098);
      }
      else {
        (*gl_00->bindProgramPipeline)(this->m_pipeline_object_ids[(uint)fs_body.field_2._12_4_]);
        GVar4 = (*gl_00->getError)();
        glu::checkError(GVar4,"glBindProgramPipeline() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x209e);
      }
      (*gl_00->getUniformSubroutineuiv)
                (local_3c8[5],(*(GLuint **)(local_3c8 + 2))[4],*(GLuint **)(local_3c8 + 2));
      (*gl_00->getUniformSubroutineuiv)
                (local_3c8[5],*(GLint *)(*(long *)(local_3c8 + 2) + 0x14),
                 (GLuint *)(*(long *)(local_3c8 + 2) + 4));
      (*gl_00->getUniformSubroutineuiv)
                (local_3c8[5],*(GLint *)(*(long *)(local_3c8 + 2) + 0x18),
                 (GLuint *)(*(long *)(local_3c8 + 2) + 8));
      (*gl_00->getUniformSubroutineuiv)
                (local_3c8[5],*(GLint *)(*(long *)(local_3c8 + 2) + 0x1c),
                 (GLuint *)(*(long *)(local_3c8 + 2) + 0xc));
      GVar4 = (*gl_00->getError)();
      glu::checkError(GVar4,"glGetUniformSubroutineuiv() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x20a9);
      *(GLuint *)(*(long *)(local_3c8 + 2) + 0x30) = local_3c8[5];
      if (this->m_po_ids[(uint)fs_body.field_2._12_4_] != *local_3c8) {
        (*gl_00->bindProgramPipeline)(0);
        GVar4 = (*gl_00->getError)();
        glu::checkError(GVar4,"glBindProgramPipeline() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x20b1);
      }
    }
    local_3cc = TEST_CASE_FIRST;
    local_3d0 = SUBROUTINE_UNIFORMS_SET_TO_VALID_VALUES;
    verifySubroutineUniformValues
              (this,&local_3cc,(uint *)(fs_body.field_2._M_local_buf + 0xc),&local_3d0);
    if ((this->m_are_pipeline_objects_supported & 1U) != 0) {
      (*gl_00->useProgram)(0);
      GVar4 = (*gl_00->getError)();
      glu::checkError(GVar4,"glUseProgram() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x20bd);
      (*gl_00->bindProgramPipeline)(this->m_pipeline_object_ids[(uint)fs_body.field_2._12_4_]);
      GVar4 = (*gl_00->getError)();
      glu::checkError(GVar4,"glBindProgramPipeline() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x20c0);
      local_3d4 = TEST_CASE_SWITCH_TO_DIFFERENT_PROGRAM_PIPELINE_OBJECT;
      local_3d8 = SUBROUTINE_UNIFORMS_SET_TO_VALID_VALUES;
      verifySubroutineUniformValues
                (this,&local_3d4,(uint *)(fs_body.field_2._M_local_buf + 0xc),&local_3d8);
      (*gl_00->bindProgramPipeline)(0);
      GVar4 = (*gl_00->getError)();
      glu::checkError(GVar4,"glBindProgramPipeline() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x20c7);
    }
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)local_c8);
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string((string *)local_40);
    fs_body.field_2._12_4_ = fs_body.field_2._12_4_ + 1;
  } while( true );
}

Assistant:

void FunctionalTest16::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (unsigned int n_id = 0; n_id < 2 /* test program/shader objects */; ++n_id)
	{
		const std::string fs_body = getShaderBody(Utils::SHADER_STAGE_FRAGMENT, n_id);
		const std::string gs_body = getShaderBody(Utils::SHADER_STAGE_GEOMETRY, n_id);
		const std::string tc_body = getShaderBody(Utils::SHADER_STAGE_TESSELLATION_CONTROL, n_id);
		const std::string te_body = getShaderBody(Utils::SHADER_STAGE_TESSELLATION_EVALUATION, n_id);
		const std::string vs_body = getShaderBody(Utils::SHADER_STAGE_VERTEX, n_id);

		if (!Utils::buildProgram(gl, vs_body, tc_body, te_body, gs_body, fs_body, DE_NULL, /* xfb_varyings */
								 DE_NULL,												   /* n_xfb_varyings */
								 m_vs_ids + n_id, m_tc_ids + n_id, m_te_ids + n_id, m_gs_ids + n_id, m_fs_ids + n_id,
								 m_po_ids + n_id))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Failed to build test program object, index:"
														   "["
							   << n_id << "]" << tcu::TestLog::EndMessage;

			TCU_FAIL("Failed to build a test program");
		}

		if (m_are_pipeline_objects_supported)
		{
			/* Initialize shader program objects */
			const char* fs_body_raw_ptr = fs_body.c_str();
			const char* gs_body_raw_ptr = gs_body.c_str();
			glw::GLint  link_status[5]  = { GL_FALSE };
			const char* tc_body_raw_ptr = tc_body.c_str();
			const char* te_body_raw_ptr = te_body.c_str();
			const char* vs_body_raw_ptr = vs_body.c_str();

			m_fs_po_ids[n_id] = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1 /* count */, &fs_body_raw_ptr);
			m_gs_po_ids[n_id] = gl.createShaderProgramv(GL_GEOMETRY_SHADER, 1 /* count */, &gs_body_raw_ptr);
			m_tc_po_ids[n_id] = gl.createShaderProgramv(GL_TESS_CONTROL_SHADER, 1 /* count */, &tc_body_raw_ptr);
			m_te_po_ids[n_id] = gl.createShaderProgramv(GL_TESS_EVALUATION_SHADER, 1 /* count */, &te_body_raw_ptr);
			m_vs_po_ids[n_id] = gl.createShaderProgramv(GL_VERTEX_SHADER, 1 /* count */, &vs_body_raw_ptr);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShaderProgramv() call failed.");

			gl.getProgramiv(m_fs_po_ids[n_id], GL_LINK_STATUS, link_status + 0);
			gl.getProgramiv(m_gs_po_ids[n_id], GL_LINK_STATUS, link_status + 1);
			gl.getProgramiv(m_tc_po_ids[n_id], GL_LINK_STATUS, link_status + 2);
			gl.getProgramiv(m_te_po_ids[n_id], GL_LINK_STATUS, link_status + 3);
			gl.getProgramiv(m_vs_po_ids[n_id], GL_LINK_STATUS, link_status + 4);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

			if (link_status[0] == GL_FALSE)
				TCU_FAIL("Fragment shader program failed to link");
			if (link_status[1] == GL_FALSE)
				TCU_FAIL("Geometry shader program failed to link");
			if (link_status[2] == GL_FALSE)
				TCU_FAIL("Tessellation control shader program failed to link");
			if (link_status[3] == GL_FALSE)
				TCU_FAIL("Tessellation evaluation shader program failed to link");
			if (link_status[4] == GL_FALSE)
				TCU_FAIL("Vertex shader program failed to link");

			/* Initialize pipeline program object */
			gl.genProgramPipelines(1 /* n */, m_pipeline_object_ids + n_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGenProgramPipelines() call failed.");

			gl.useProgramStages(m_pipeline_object_ids[n_id], GL_FRAGMENT_SHADER_BIT, m_fs_po_ids[n_id]);
			gl.useProgramStages(m_pipeline_object_ids[n_id], GL_GEOMETRY_SHADER_BIT, m_gs_po_ids[n_id]);
			gl.useProgramStages(m_pipeline_object_ids[n_id], GL_TESS_CONTROL_SHADER_BIT, m_tc_po_ids[n_id]);
			gl.useProgramStages(m_pipeline_object_ids[n_id], GL_TESS_EVALUATION_SHADER_BIT, m_te_po_ids[n_id]);
			gl.useProgramStages(m_pipeline_object_ids[n_id], GL_VERTEX_SHADER_BIT, m_vs_po_ids[n_id]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed.");
		}

		/* Retrieve subroutine locations */
		struct _item
		{
			glw::GLuint	po_id;
			_shader_stage& stage;
			glw::GLuint	so_id;
			glw::GLenum	so_type;
		} items[] = {
			{ m_po_ids[n_id], m_po_descriptors[n_id].fragment, m_fs_ids[n_id], GL_FRAGMENT_SHADER },
			{ m_po_ids[n_id], m_po_descriptors[n_id].geometry, m_gs_ids[n_id], GL_GEOMETRY_SHADER },
			{ m_po_ids[n_id], m_po_descriptors[n_id].tess_control, m_tc_ids[n_id], GL_TESS_CONTROL_SHADER },
			{ m_po_ids[n_id], m_po_descriptors[n_id].tess_evaluation, m_te_ids[n_id], GL_TESS_EVALUATION_SHADER },
			{ m_po_ids[n_id], m_po_descriptors[n_id].vertex, m_vs_ids[n_id], GL_VERTEX_SHADER },

			{ m_fs_po_ids[n_id], m_fs_po_descriptors[n_id], m_fs_po_ids[n_id], GL_FRAGMENT_SHADER },
			{ m_gs_po_ids[n_id], m_gs_po_descriptors[n_id], m_gs_po_ids[n_id], GL_GEOMETRY_SHADER },
			{ m_tc_po_ids[n_id], m_tc_po_descriptors[n_id], m_tc_po_ids[n_id], GL_TESS_CONTROL_SHADER },
			{ m_te_po_ids[n_id], m_te_po_descriptors[n_id], m_te_po_ids[n_id], GL_TESS_EVALUATION_SHADER },
			{ m_vs_po_ids[n_id], m_vs_po_descriptors[n_id], m_vs_po_ids[n_id], GL_VERTEX_SHADER },
		};
		const unsigned int n_items = sizeof(items) / sizeof(items[0]);

		for (unsigned int n_item = 0; n_item < n_items; ++n_item)
		{
			_item& current_item = items[n_item];

			current_item.stage.function1_index =
				gl.getSubroutineIndex(current_item.po_id, current_item.so_type, "function1");
			current_item.stage.function2_index =
				gl.getSubroutineIndex(current_item.po_id, current_item.so_type, "function2");
			current_item.stage.function3_index =
				gl.getSubroutineIndex(current_item.po_id, current_item.so_type, "function3");
			current_item.stage.function4_index =
				gl.getSubroutineIndex(current_item.po_id, current_item.so_type, "function4");
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSubroutineIndex() call(s) failed.");

			if (current_item.stage.function1_index == GL_INVALID_INDEX ||
				current_item.stage.function2_index == GL_INVALID_INDEX ||
				current_item.stage.function3_index == GL_INVALID_INDEX ||
				current_item.stage.function4_index == GL_INVALID_INDEX)
			{
				TCU_FAIL("Subroutine name was not recognized.");
			}

			current_item.stage.subroutine1_uniform_location =
				gl.getSubroutineUniformLocation(current_item.po_id, current_item.so_type, "subroutine1");
			current_item.stage.subroutine2_uniform_location =
				gl.getSubroutineUniformLocation(current_item.po_id, current_item.so_type, "subroutine2");
			current_item.stage.subroutine3_uniform_location =
				gl.getSubroutineUniformLocation(current_item.po_id, current_item.so_type, "subroutine3");
			current_item.stage.subroutine4_uniform_location =
				gl.getSubroutineUniformLocation(current_item.po_id, current_item.so_type, "subroutine4");
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSubroutineUniformLocation() call(s) failed.");

			if (current_item.stage.subroutine1_uniform_location == -1 ||
				current_item.stage.subroutine2_uniform_location == -1 ||
				current_item.stage.subroutine3_uniform_location == -1 ||
				current_item.stage.subroutine4_uniform_location == -1)
			{
				TCU_FAIL("Subroutine uniform name was not recognized.");
			}

			if (m_po_ids[n_id] == current_item.po_id)
			{
				gl.useProgram(current_item.po_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");
			}
			else
			{
				/* Temporarily bind the program pipeline. */
				gl.bindProgramPipeline(m_pipeline_object_ids[n_id]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline() call failed.");
			}

			gl.getUniformSubroutineuiv(current_item.so_type, current_item.stage.subroutine1_uniform_location,
									   &current_item.stage.default_subroutine1_value);
			gl.getUniformSubroutineuiv(current_item.so_type, current_item.stage.subroutine2_uniform_location,
									   &current_item.stage.default_subroutine2_value);
			gl.getUniformSubroutineuiv(current_item.so_type, current_item.stage.subroutine3_uniform_location,
									   &current_item.stage.default_subroutine3_value);
			gl.getUniformSubroutineuiv(current_item.so_type, current_item.stage.subroutine4_uniform_location,
									   &current_item.stage.default_subroutine4_value);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformSubroutineuiv() call(s) failed.");

			current_item.stage.gl_stage = current_item.so_type;

			if (m_po_ids[n_id] != current_item.po_id)
			{
				/* Unbind the program pipeline object */
				gl.bindProgramPipeline(0);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline() call failed.");
			}
		} /* for (all items) */

		/* Make sure the default subroutine choices are valid. */
		verifySubroutineUniformValues(
			TEST_CASE_SWITCH_TO_DIFFERENT_PROGRAM_OBJECT, /* makes the verification routine use program object descriptor */
			n_id, SUBROUTINE_UNIFORMS_SET_TO_VALID_VALUES);

		if (m_are_pipeline_objects_supported)
		{
			gl.useProgram(0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

			gl.bindProgramPipeline(m_pipeline_object_ids[n_id]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline() call failed.");
			{
				verifySubroutineUniformValues(
					TEST_CASE_SWITCH_TO_DIFFERENT_PROGRAM_PIPELINE_OBJECT, /* makes the verification routine use pipeline object descriptor */
					n_id, SUBROUTINE_UNIFORMS_SET_TO_VALID_VALUES);
			}
			gl.bindProgramPipeline(0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline() call failed.");
		}
	} /* for (both program descriptors) */
}